

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_changemode(lua_State *L,int newmode)

{
  global_State *g;
  
  g = L->l_G;
  if ((uint)g->gckind != newmode) {
    if (newmode == 1) {
      entergen(L,g);
    }
    else {
      enterinc(g);
    }
  }
  g->lastatomic = 0;
  return;
}

Assistant:

void luaC_changemode (lua_State *L, int newmode) {
  global_State *g = G(L);
  if (newmode != g->gckind) {
    if (newmode == KGC_GEN)  /* entering generational mode? */
      entergen(L, g);
    else
      enterinc(g);  /* entering incremental mode */
  }
  g->lastatomic = 0;
}